

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.cxx
# Opt level: O0

string * __thiscall cm::String::str_if_stable_abi_cxx11_(String *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  size_type sVar4;
  size_type sVar5;
  element_type *peVar6;
  String *this_local;
  
  pcVar2 = data(this);
  if (pcVar2 == (char *)0x0) {
    this_local = (String *)empty_string__abi_cxx11_;
  }
  else {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
    if (bVar1) {
      pcVar2 = data(this);
      std::
      __shared_ptr_access<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)this);
      pcVar3 = (char *)std::__cxx11::string::data();
      if (pcVar2 == pcVar3) {
        sVar4 = size(this);
        std::
        __shared_ptr_access<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)this);
        sVar5 = std::__cxx11::string::size();
        if (sVar4 == sVar5) {
          peVar6 = std::
                   __shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ::get((__shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                          *)this);
          return peVar6;
        }
      }
    }
    this_local = (String *)0x0;
  }
  return (string *)this_local;
}

Assistant:

std::string const* String::str_if_stable() const
{
  if (!this->data()) {
    // We view no string.
    // This is stable for the lifetime of our current value.
    return &empty_string_;
  }

  if (this->string_ && this->data() == this->string_->data() &&
      this->size() == this->string_->size()) {
    // We view an entire string.
    // This is stable for the lifetime of our current value.
    return this->string_.get();
  }

  return nullptr;
}